

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O3

void select_tx_block(AV1_COMP *cpi,MACROBLOCK *x,int blk_row,int blk_col,int block,TX_SIZE tx_size,
                    int depth,BLOCK_SIZE plane_bsize,ENTROPY_CONTEXT *ta,ENTROPY_CONTEXT *tl,
                    TXFM_CONTEXT *tx_above,TXFM_CONTEXT *tx_left,RD_STATS *rd_stats,
                    int64_t prev_level_rd,int64_t ref_best_rd,int *is_cost_valid,
                    FAST_TX_SEARCH_MODE ftxs_mode)

{
  uint8_t uVar1;
  uint8_t uVar2;
  byte bVar3;
  short *psVar4;
  MB_MODE_INFO *pMVar5;
  long lVar6;
  NN_CONFIG *pNVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  byte bVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  undefined4 in_register_0000000c;
  long lVar17;
  float *pfVar18;
  TXFM_CONTEXT *__s;
  byte bVar19;
  bool bVar20;
  long lVar21;
  int16_t *piVar22;
  int iVar23;
  TX_SIZE TVar24;
  float *pfVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  undefined7 in_register_00000089;
  int iVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  int c;
  int iVar33;
  long lVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  MB_MODE_INFO *pMVar38;
  bool bVar39;
  float fVar40;
  uint uVar41;
  float fVar42;
  double dVar43;
  float fVar44;
  int16_t *piVar45;
  double dVar46;
  float fVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int16_t *local_1e8;
  float *local_1b8;
  float *local_1b0;
  long local_198;
  int x_sum;
  undefined3 uStack_188;
  int local_184;
  MB_MODE_INFO *local_180;
  ulong local_178;
  long local_170;
  ulong local_168;
  long local_160;
  ulong local_158;
  ulong local_150;
  int16_t *local_148;
  double local_140;
  float features [64];
  
  local_1b8 = (float *)CONCAT71(in_register_00000089,tx_size);
  local_1b0 = (float *)CONCAT44(in_register_0000000c,blk_col);
  rd_stats->rate = 0;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0;
  rd_stats->rdcost = 0;
  rd_stats->sse = 0;
  rd_stats->skip_txfm = '\x01';
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }
  local_170 = (long)blk_col;
  lVar34 = (long)blk_row;
  uVar37 = (ulong)tx_size;
  uVar27 = *(uint *)((long)tx_size_wide + (ulong)((uint)tx_size * 4));
  uVar41 = *(uint *)((long)tx_size_high + (ulong)((uint)tx_size * 4));
  pMVar38 = *(x->e_mbd).mi;
  if (tx_size == '\0') {
    local_178 = 0;
  }
  else {
    bVar13 = block_size_high[pMVar38->bsize];
    if (block_size_high[pMVar38->bsize] < block_size_wide[pMVar38->bsize]) {
      bVar13 = block_size_wide[pMVar38->bsize];
    }
    bVar19 = 1;
    local_178 = 0x3f;
    if (bVar13 < 0x20) {
      if (bVar13 == 8) {
        TVar24 = '\x01';
        bVar19 = 0;
      }
      else {
        if (bVar13 != 0x10) goto LAB_002399d6;
        TVar24 = '\x02';
        bVar19 = 1;
      }
LAB_002399b1:
      local_178 = (ulong)(byte)(((""[uVar37] != TVar24 & bVar19) + TVar24 * -2) * '\x03' + 0x18);
    }
    else {
      TVar24 = '\x04';
      if ((bVar13 == 0x80) || (bVar13 == 0x40)) goto LAB_002399b1;
      if (bVar13 == 0x20) {
        TVar24 = '\x03';
        bVar19 = 1;
        goto LAB_002399b1;
      }
    }
LAB_002399d6:
    local_178 = (ulong)((uint)tx_left[lVar34] < (uVar41 & 0xff)) +
                (ulong)((uint)tx_above[local_170] < (uVar27 & 0xff)) + local_178;
  }
  local_158 = (ulong)(uint)depth;
  uVar14 = (ulong)plane_bsize;
  if (((cpi->oxcf).txfm_cfg.enable_tx64 == false) && ((0x61810UL >> (uVar37 & 0x3f) & 1) != 0)) {
    bVar16 = depth < 2 && tx_size != '\0';
    uVar32 = (ulong)bVar16;
    bVar20 = bVar16;
LAB_00239d72:
    bVar13 = 0;
  }
  else {
    bVar13 = uVar27 == uVar41 | (cpi->oxcf).txfm_cfg.enable_rect_tx;
    bVar39 = tx_size != '\0';
    uVar32 = (ulong)bVar39;
    bVar20 = depth < 2 && bVar39;
    bVar16 = bVar20;
    if ((depth < 2 && bVar39) && (bVar13 != 0)) {
      lVar15 = (long)(cpi->sf).tx_sf.prune_tx_size_level;
      bVar13 = 1;
      if (0 < lVar15) {
        bVar13 = block_size_wide[uVar14];
        piVar22 = x->plane[0].src_diff + lVar34 * (ulong)bVar13 * 4 + (long)(blk_col * 4);
        uVar35 = (int)uVar41 >> ((int)uVar27 <= (int)uVar41);
        uVar36 = (int)uVar27 >> ((int)uVar41 <= (int)uVar27);
        local_140 = (double)(int)(uVar36 * uVar35);
        local_160 = (ulong)bVar13 * (ulong)uVar35 * 2;
        piVar45 = (int16_t *)0x0;
        dVar46 = 0.0;
        fVar44 = 0.0;
        uVar32 = 0;
        iVar23 = 0;
        lVar17 = 0;
        iVar33 = 0;
        fVar47 = 0.0;
        local_168 = CONCAT44(local_168._4_4_,(float)(int)(uVar36 * uVar35));
        local_180 = pMVar38;
        do {
          iVar30 = 0;
          local_150 = uVar32;
          local_148 = piVar22;
          do {
            iVar26 = iVar33;
            local_1e8 = piVar45;
            local_198 = lVar17;
            (*aom_get_blk_sse_sum)(piVar22,(uint)bVar13,uVar36,uVar35,&x_sum,(int64_t *)features);
            fVar42 = (float)x_sum / (float)local_168;
            fVar40 = (float)((double)CONCAT44(features[1],features[0]) / local_140) -
                     fVar42 * fVar42;
            iVar23 = iVar23 + x_sum;
            fVar44 = fVar44 + fVar40;
            fVar47 = fVar47 + fVar42;
            piVar45 = (int16_t *)((double)local_1e8 + (double)(fVar40 * fVar40));
            dVar46 = dVar46 + (double)(fVar42 * fVar42);
            lVar17 = local_198 + CONCAT44(features[1],features[0]);
            iVar33 = iVar26 + 1;
            iVar30 = iVar30 + uVar36;
            piVar22 = piVar22 + uVar36;
          } while (iVar30 < (int)uVar27);
          uVar32 = local_150 + uVar35;
          piVar22 = (int16_t *)((long)local_148 + local_160);
        } while (uVar32 < uVar41);
        if (iVar26 < 1) {
          fVar47 = 0.0;
          fVar44 = 0.0;
        }
        else {
          fVar40 = (float)iVar23 / (float)(int)(uVar41 * uVar27);
          fVar42 = (float)lVar17 / (float)(int)(uVar41 * uVar27) - fVar40 * fVar40;
          fVar47 = (fVar47 + fVar40) / 5.0;
          piVar45 = (int16_t *)((double)(fVar42 * fVar42) + (double)piVar45);
          dVar43 = (double)(iVar26 + 2);
          fVar40 = (float)((dVar46 + (double)(fVar40 * fVar40)) / dVar43) - fVar47 * fVar47;
          fVar47 = 0.0;
          if (0.0 < fVar40) {
            if (fVar40 < 0.0) {
              fVar47 = sqrtf(fVar40);
              local_1e8 = piVar45;
            }
            else {
              fVar47 = SQRT(fVar40);
            }
          }
          fVar44 = (fVar44 + fVar42) / (float)(iVar26 + 2);
          fVar44 = (float)((double)piVar45 / dVar43) - fVar44 * fVar44;
        }
        psVar4 = x->plane[0].dequant_QTX;
        iVar23 = (int)*psVar4 >> 3;
        iVar33 = (int)psVar4[1] >> 3;
        local_1b8 = (float *)((ulong)local_1b8 & 0xffffffff);
        if ((fVar47 <= (float)iVar23) &&
           ((float)*(int *)(&DAT_00503a20 + lVar15 * 4) * fVar44 <= (float)(iVar33 * iVar33))) {
          bVar16 = false;
        }
        bVar13 = 1;
        uVar35 = iVar23 * *(int *)(&DAT_00503a10 + lVar15 * 4);
        uVar32 = (ulong)uVar35;
        pMVar38 = local_180;
        if (((float)(int)uVar35 < fVar47) &&
           ((float)(iVar33 * iVar33 * *(int *)(&DAT_00503a10 + lVar15 * 4)) < fVar44))
        goto LAB_00239d72;
      }
    }
  }
  local_168 = (ulong)ftxs_mode;
  TVar24 = (TX_SIZE)local_1b8;
  uVar35 = (uint)tx_size;
  if ((((cpi->sf).rt_sf.skip_tx_no_split_var_based_partition == 0) || (!bVar16)) ||
     (x->try_merge_partition == 0)) {
    if (bVar13 != 0) goto LAB_00239f26;
    uVar2 = '\x10';
    uVar1 = '\0';
    lVar15 = 0x7fffffffffffffff;
LAB_0023a41f:
    bVar13 = (byte)uVar32;
    if (((x->e_mbd).bd == 8) && (bVar16)) {
LAB_0023a435:
      if (((ref_best_rd != 0x7fffffffffffffff) || (lVar15 != 0x7fffffffffffffff)) &&
         (iVar33 = (cpi->sf).tx_sf.tx_type_search.ml_tx_split_thresh, -1 < iVar33)) {
        if (TVar24 == '\0') {
          iVar23 = -1;
        }
        else {
          bVar13 = block_size_wide[uVar14];
          pNVar7 = av1_tx_split_nnconfig_map[uVar37];
          local_1e8 = x->plane[0].src_diff + lVar34 * (ulong)bVar13 * 4 + (long)(blk_col * 4);
          local_1b0 = features;
          memset(local_1b0,0,0x100);
          get_mean_dev_features(local_1e8,(uint)bVar13,uVar27,uVar41,local_1b0);
          x_sum = 0;
          (*av1_nn_predict)(local_1b0,pNVar7,1,(float *)&x_sum);
          uVar32 = 80000;
          if ((int)((float)x_sum * 10000.0) < 80000) {
            uVar32 = (ulong)(uint)(int)((float)x_sum * 10000.0);
          }
          iVar23 = -80000;
          if (-80000 < (int)uVar32) {
            iVar23 = (int)uVar32;
          }
        }
        bVar13 = (byte)uVar32;
        uVar60 = (uint)local_1e8;
        if (SBORROW4(iVar23,-iVar33) != iVar23 + iVar33 < 0) goto LAB_0023a574;
      }
    }
    else {
      uVar60 = (uint)local_1e8;
      if (!bVar16) goto LAB_0023a574;
    }
LAB_0023a590:
    if (lVar15 < ref_best_rd) {
      ref_best_rd = lVar15;
    }
    uVar36 = (uint)block_size_high[uVar14];
    iVar33 = (x->e_mbd).mb_to_bottom_edge;
    if (iVar33 < 0) {
      uVar36 = (uint)block_size_high[uVar14] +
               (iVar33 >> ((char)(x->e_mbd).plane[0].subsampling_y + 3U & 0x1f));
    }
    uVar60 = (uint)block_size_wide[uVar14];
    iVar33 = (x->e_mbd).mb_to_right_edge;
    if (iVar33 < 0) {
      uVar60 = (uint)block_size_wide[uVar14] +
               (iVar33 >> ((char)(x->e_mbd).plane[0].subsampling_x + 3U & 0x1f));
    }
    iVar33 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar35 * 4));
    iVar23 = *(int *)((long)tx_size_high_unit + (ulong)(uVar35 * 4));
    bVar13 = ""[uVar37];
    local_148 = (int16_t *)CONCAT44(local_148._4_4_,(uint)bVar13);
    iVar30 = tx_size_wide_unit[bVar13];
    iVar26 = tx_size_high_unit[bVar13];
    local_160 = CONCAT44(local_160._4_4_,iVar26 * iVar30);
    local_1e8._0_4_ = (x->mode_costs).txfm_partition_cost[local_178][1];
    local_180 = (MB_MODE_INFO *)CONCAT44(local_180._4_4_,iVar26);
    local_158 = (ulong)((int)local_158 + 1);
    local_150 = (ulong)((iVar23 / iVar26) * (iVar33 / iVar30));
    bVar13 = 1;
    uVar32 = 0;
    local_198._0_4_ = 0.0;
    local_1b8 = (float *)0x0;
    lVar17 = 0;
    local_1b0 = (float *)0x0;
    iVar26 = block;
    while( true ) {
      iVar28 = blk_row + (int)uVar32;
      local_140 = (double)CONCAT44(local_140._4_4_,iVar28);
      if ((int)uVar36 >> 2 <= iVar28) break;
      iVar28 = 0;
      local_178 = uVar32;
      fVar44 = (float)local_198;
      do {
        local_198._0_4_ = fVar44;
        if (blk_col + iVar28 < (int)uVar60 >> 2) {
          local_184 = 1;
          select_tx_block(cpi,x,local_140._0_4_,blk_col + iVar28,iVar26,(TX_SIZE)local_148,
                          (int)local_158,plane_bsize,ta,tl,tx_above,tx_left,(RD_STATS *)features,
                          lVar15 / (long)local_150,ref_best_rd - lVar17,&local_184,
                          (FAST_TX_SEARCH_MODE)local_168);
          pfVar25 = local_1b0;
          pfVar18 = local_1b8;
          if (local_184 != 0) {
            pfVar18 = (float *)0x7fffffffffffffff;
            uVar61 = 0x7fffffff;
            if ((uint)local_1e8 == 0x7fffffff) {
              local_198._0_4_ = 0.0;
              pfVar25 = (float *)0x7fffffffffffffff;
              bVar19 = 0;
            }
            else {
              local_198._0_4_ = 0.0;
              pfVar25 = pfVar18;
              bVar19 = 0;
              if ((long)(int)features[0] != 0x7fffffff) {
                lVar17 = (long)(int)features[0] + (long)(int)(uint)local_1e8;
                if (0x7ffffffe < lVar17) {
                  lVar17 = 0x7fffffff;
                }
                local_198._0_4_ = fVar44;
                if (fVar44 == 0.0) {
                  local_198._0_4_ = features[1];
                }
                pfVar25 = (float *)((long)local_1b0 + features._8_8_);
                lVar21 = 0;
                if (features._24_8_ != 0x7fffffffffffffff) {
                  lVar21 = features._24_8_;
                }
                pfVar18 = (float *)(lVar21 + (long)local_1b8);
                if (local_1b8 == (float *)0x7fffffffffffffff) {
                  pfVar18 = (float *)0x7fffffffffffffff;
                }
                uVar61 = (uint)lVar17;
                bVar19 = bVar13 & features[8]._0_1_;
              }
            }
            bVar13 = bVar19;
            local_1e8._0_4_ = uVar61;
            lVar17 = (long)pfVar25 * 0x80 +
                     ((long)x->rdmult * (long)(int)(uint)local_1e8 + 0x100 >> 9);
            if (lVar17 <= ref_best_rd) {
              iVar26 = iVar26 + (int)local_160;
              local_1b8 = pfVar18;
              local_1b0 = pfVar25;
              goto LAB_0023a844;
            }
          }
          lVar17 = 0x7fffffffffffffff;
          local_1b0 = pfVar25;
          local_1b8 = pfVar18;
          goto LAB_0023a9af;
        }
LAB_0023a844:
        iVar28 = iVar28 + iVar30;
        fVar44 = (float)local_198;
      } while (iVar28 < iVar33);
      uVar61 = (int)local_178 + (int)local_180;
      uVar32 = (ulong)uVar61;
      if (iVar23 <= (int)uVar61) break;
    }
  }
  else {
    uVar32 = (ulong)block;
    if ((x->plane[0].eobs[uVar32] != 0) || (bVar13 == 0)) {
      if ((x->e_mbd).bd != 8) {
        uVar2 = '\x10';
        uVar1 = '\0';
        lVar15 = 0x7fffffffffffffff;
        goto LAB_0023a590;
      }
      uVar2 = '\x10';
      uVar1 = '\0';
      lVar15 = 0x7fffffffffffffff;
      goto LAB_0023a435;
    }
LAB_00239f26:
    pMVar5 = *(x->e_mbd).mi;
    uVar60 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar14];
    local_1e8 = (int16_t *)(ulong)uVar60;
    bVar13 = ""[uVar37];
    bVar19 = ""[uVar37];
    get_txb_ctx(plane_bsize,tx_size,0,ta + local_170,tl + lVar34,(TXB_CTX *)&x_sum);
    uVar36 = (x->coeff_costs).coeff_costs[(uint)bVar13 + (uint)bVar19 + 1 >> 1 & 0xff][0].
             txb_skip_cost[x_sum][1];
    rd_stats->zero_rate = uVar36;
    pMVar5->inter_tx_size
    [(blk_col >> (av1_get_txb_size_index_tw_w_log2_table[uVar14] & 0x1f)) +
     ((blk_row >> (av1_get_txb_size_index_tw_h_log2_table[uVar14] & 0x1f)) <<
     (av1_get_txb_size_index_stride_log2_table[uVar14] & 0x1f))] = TVar24;
    local_1b8 = local_1b0;
    search_tx_type(cpi,x,0,block,blk_row,blk_col,plane_bsize,tx_size,(TXB_CTX *)&x_sum,
                   (FAST_TX_SEARCH_MODE)local_168,0,ref_best_rd,(RD_STATS *)features);
    if (((long)rd_stats->rate == 0x7fffffff) || ((long)(int)features[0] == 0x7fffffff)) {
      rd_stats->rate = 0x7fffffff;
      rd_stats->zero_rate = 0;
      rd_stats->dist = 0x7fffffffffffffff;
      rd_stats->rdcost = 0x7fffffffffffffff;
      rd_stats->sse = 0x7fffffffffffffff;
      rd_stats->skip_txfm = '\0';
      if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
        lVar21 = 0x7fffffff;
        lVar17 = -0x80;
        lVar15 = 0x7fffffffffffffff;
LAB_0023a133:
        local_1b8 = (float *)(ulong)uVar36;
        if (lVar15 * 0x80 + ((long)(int)uVar36 * (long)x->rdmult + 0x100 >> 9) <=
            (lVar21 * x->rdmult + 0x100 >> 9) + lVar17) goto LAB_0023a25c;
        bVar13 = 0;
      }
      else {
        bVar13 = 0;
      }
    }
    else {
      lVar21 = (long)(int)features[0] + (long)rd_stats->rate;
      if (0x7ffffffe < lVar21) {
        lVar21 = 0x7fffffff;
      }
      rd_stats->rate = (int)lVar21;
      if (rd_stats->zero_rate == 0) {
        rd_stats->zero_rate = (int)features[1];
      }
      lVar17 = rd_stats->dist + features._8_8_;
      lVar6 = rd_stats->sse;
      rd_stats->dist = lVar17;
      local_1b8 = (float *)(ulong)uVar36;
      lVar15 = 0x7fffffffffffffff;
      if ((lVar6 != 0x7fffffffffffffff) && (lVar15 = lVar6, features._24_8_ != 0x7fffffffffffffff))
      {
        rd_stats->sse = features._24_8_ + lVar6;
        lVar15 = features._24_8_ + lVar6;
      }
      bVar13 = rd_stats->skip_txfm & features[8]._0_1_;
      rd_stats->skip_txfm = bVar13;
      if ((x->e_mbd).lossless[*(ushort *)&pMVar5->field_0xa7 & 7] == 0) {
        if (bVar13 != 1) {
          lVar17 = lVar17 * 0x80;
          lVar21 = (long)(int)lVar21;
          goto LAB_0023a133;
        }
LAB_0023a25c:
        local_1b8 = (float *)(ulong)uVar36;
        rd_stats->rate = uVar36;
        rd_stats->dist = lVar15;
        x->plane[0].eobs[block] = 0;
        iVar33 = (x->e_mbd).tx_type_map_stride;
        (x->e_mbd).tx_type_map[iVar33 * blk_row + blk_col] = '\0';
        iVar23 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar35 * 4));
        iVar30 = *(int *)((long)tx_size_high_unit + (ulong)(uVar35 * 4));
        if (((0x41010UL >> (uVar37 & 0x3f) & 1) != 0) ||
           (bVar13 = 1, (0x20810UL >> (uVar37 & 0x3f) & 1) != 0)) {
          lVar15 = iVar33 * lVar34 + local_170;
          lVar17 = 0;
          do {
            lVar21 = 0;
            do {
              local_1b8 = (float *)((x->e_mbd).tx_type_map + lVar15);
              *(undefined1 *)(lVar21 + (long)local_1b8) = 0;
              lVar21 = lVar21 + 4;
            } while (lVar21 < iVar23);
            lVar17 = lVar17 + 4;
            lVar15 = lVar15 + (long)iVar33 * 4;
          } while (lVar17 < iVar30);
          bVar13 = 1;
        }
      }
      else {
        bVar13 = 0;
      }
    }
    rd_stats->skip_txfm = bVar13;
    iVar33 = uVar60 * blk_row + blk_col;
    (x->txfm_search_info).blk_skip[iVar33] = (x->txfm_search_info).blk_skip[iVar33] & 0xfe | bVar13;
    iVar33 = rd_stats->rate;
    if (bVar20) {
      iVar33 = iVar33 + (x->mode_costs).txfm_partition_cost[local_178][0];
      rd_stats->rate = iVar33;
    }
    lVar15 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)iVar33 + 0x100 >> 9);
    uVar1 = x->plane[0].txb_entropy_ctx[block];
    uVar32 = (ulong)((x->e_mbd).tx_type_map_stride * blk_row + blk_col);
    uVar2 = (x->e_mbd).tx_type_map[uVar32];
    iVar33 = (cpi->sf).tx_sf.adaptive_txb_search_level;
    if (iVar33 != 0) {
      cVar12 = (char)iVar33;
      if (ref_best_rd < lVar15 - (lVar15 >> (cVar12 + 1U & 0x3f))) goto LAB_0023afeb;
      uVar32 = 0;
      if (prev_level_rd < lVar15 - (lVar15 >> (cVar12 + 2U & 0x3f))) {
        bVar16 = false;
      }
    }
    bVar13 = (byte)uVar32;
    if (((cpi->sf).tx_sf.txb_split_cap == 0) || (x->plane[0].eobs[block] != 0)) goto LAB_0023a41f;
LAB_0023a574:
    local_1e8._0_4_ = uVar60;
    lVar17 = 0x7fffffffffffffff;
  }
LAB_0023a9af:
  if (lVar15 < lVar17) {
    __s = tx_above + local_170;
    x->plane[0].txb_entropy_ctx[block] = uVar1;
    iVar33 = *(int *)((long)tx_size_wide_unit + (ulong)(uVar35 * 4));
    bVar13 = x->plane[0].txb_entropy_ctx[block];
    memset(ta + local_170,(uint)bVar13,(long)iVar33);
    iVar23 = *(int *)((long)tx_size_high_unit + (ulong)(uVar35 * 4));
    memset(tl + lVar34,(uint)bVar13,(long)iVar23);
    bVar13 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
             [txsize_to_bsize[uVar37]];
    memset(tx_left + lVar34,uVar41,
           (ulong)((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                         [txsize_to_bsize[uVar37]] +
                   (uint)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                          [txsize_to_bsize[uVar37]] == 0) & 0xff));
    memset(__s,uVar27,(ulong)((uint)bVar13 + (uint)(bVar13 == 0) & 0xff));
    iVar30 = 1;
    if (1 < iVar33) {
      iVar30 = iVar33;
    }
    iVar26 = 1;
    if (1 < iVar23) {
      iVar26 = iVar23;
    }
    bVar13 = av1_get_txb_size_index_tw_h_log2_table[uVar14];
    bVar19 = av1_get_txb_size_index_stride_log2_table[uVar14];
    bVar3 = av1_get_txb_size_index_tw_w_log2_table[uVar14];
    uVar27 = iVar30 - 1;
    iVar28 = 0;
    uVar41 = uVar27 ^ 0x80000000;
    uVar35 = uVar27 ^ 0x80000000;
    uVar36 = uVar27 ^ 0x80000000;
    uVar27 = uVar27 ^ 0x80000000;
    do {
      iVar29 = (iVar28 + blk_row >> (bVar13 & 0x1f)) << (bVar19 & 0x1f);
      uVar31 = 0;
      uVar60 = 0xc;
      uVar61 = 0xd;
      uVar62 = 0xe;
      uVar63 = 0xf;
      uVar56 = 8;
      uVar57 = 9;
      uVar58 = 10;
      uVar59 = 0xb;
      uVar52 = 4;
      uVar53 = 5;
      uVar54 = 6;
      uVar55 = 7;
      uVar48 = 0;
      uVar49 = 1;
      uVar50 = 2;
      uVar51 = 3;
      do {
        bVar16 = (int)uVar35 < (int)(uVar49 ^ 0x80000000);
        auVar64._4_4_ = -(uint)((int)uVar36 < (int)(uVar50 ^ 0x80000000));
        auVar64._0_4_ = -(uint)bVar16;
        auVar64._8_4_ = -(uint)((int)uVar27 < (int)(uVar51 ^ 0x80000000));
        auVar64._12_4_ = 0;
        if ((bool)(~((int)uVar41 < (int)(uVar48 ^ 0x80000000)) & 1)) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        if (!bVar16) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 1) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar64 = (auVar64 << 0x20 ^ auVar8) >> 0x30;
        auVar64 = packsswb(auVar64,auVar64);
        if ((auVar64._0_4_ >> 0x18 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 3) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar65._0_4_ = -(uint)((int)uVar41 < (int)(uVar52 ^ 0x80000000));
        auVar65._4_4_ = -(uint)((int)uVar35 < (int)(uVar53 ^ 0x80000000));
        auVar65._8_4_ = -(uint)((int)uVar36 < (int)(uVar54 ^ 0x80000000));
        auVar65._12_4_ = -(uint)((int)uVar27 < (int)(uVar55 ^ 0x80000000));
        if ((((ushort)auVar65._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 4) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar65 = auVar65 ^ auVar9;
        auVar68._0_8_ = auVar65._0_8_ << 0x30;
        auVar68._8_8_ = auVar65._8_8_ << 0x30 | auVar65._0_8_ >> 0x10;
        auVar64 = packsswb(auVar68,auVar68);
        if ((auVar64._4_2_ >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 5) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        if ((auVar65 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 6) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        if ((auVar65._11_2_ >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 7) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar66._0_4_ = -(uint)((int)uVar41 < (int)(uVar56 ^ 0x80000000));
        auVar66._4_4_ = -(uint)((int)uVar35 < (int)(uVar57 ^ 0x80000000));
        auVar66._8_4_ = -(uint)((int)uVar36 < (int)(uVar58 ^ 0x80000000));
        auVar66._12_4_ = -(uint)((int)uVar27 < (int)(uVar59 ^ 0x80000000));
        if ((((ushort)auVar66._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 8) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        if ((SUB162(auVar66 ^ auVar10,3) >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 9) >> (bVar3 & 0x1f)) + iVar29] = TVar24;
        }
        auVar64 = pshufhw(auVar66,auVar66,0);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        if (((auVar64 ^ auVar11) & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 10) >> (bVar3 & 0x1f)) + iVar29] = TVar24
          ;
        }
        auVar64 = packsswb(auVar64 ^ auVar11,(auVar66 ^ auVar10) >> 0x30);
        if ((auVar64._10_2_ >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 0xb) >> (bVar3 & 0x1f)) + iVar29] =
               TVar24;
        }
        auVar67._0_4_ = -(uint)((int)uVar41 < (int)(uVar60 ^ 0x80000000));
        auVar67._4_4_ = -(uint)((int)uVar35 < (int)(uVar61 ^ 0x80000000));
        auVar67._8_4_ = -(uint)((int)uVar36 < (int)(uVar62 ^ 0x80000000));
        auVar67._12_4_ = -(uint)((int)uVar27 < (int)(uVar63 ^ 0x80000000));
        if ((((ushort)auVar67._0_4_ ^ 0xffff) & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 0xc) >> (bVar3 & 0x1f)) + iVar29] =
               TVar24;
        }
        auVar69._8_4_ = 0xffffffff;
        auVar69._0_8_ = 0xffffffffffffffff;
        auVar69._12_4_ = 0xffffffff;
        auVar69 = auVar67 ^ auVar69;
        auVar70._0_8_ = auVar69._0_8_ << 0x30;
        auVar70._8_8_ = auVar69._8_8_ << 0x30 | auVar69._0_8_ >> 0x10;
        auVar64 = packsswb(auVar70,auVar70);
        if ((auVar64._12_2_ >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 0xd) >> (bVar3 & 0x1f)) + iVar29] =
               TVar24;
        }
        auVar64 = pshufhw(auVar67,auVar67,0);
        if (((auVar64._14_2_ ^ 0xffff) & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 0xe) >> (bVar3 & 0x1f)) + iVar29] =
               TVar24;
        }
        if ((auVar69._14_2_ >> 8 & 1) != 0) {
          pMVar38->inter_tx_size[((int)(blk_col + uVar31 + 0xf) >> (bVar3 & 0x1f)) + iVar29] =
               TVar24;
        }
        uVar31 = uVar31 + 0x10;
        uVar48 = uVar48 + 0x10;
        uVar49 = uVar49 + 0x10;
        uVar50 = uVar50 + 0x10;
        uVar51 = uVar51 + 0x10;
        uVar52 = uVar52 + 0x10;
        uVar53 = uVar53 + 0x10;
        uVar54 = uVar54 + 0x10;
        uVar55 = uVar55 + 0x10;
        uVar56 = uVar56 + 0x10;
        uVar57 = uVar57 + 0x10;
        uVar58 = uVar58 + 0x10;
        uVar59 = uVar59 + 0x10;
        uVar60 = uVar60 + 0x10;
        uVar61 = uVar61 + 0x10;
        uVar62 = uVar62 + 0x10;
        uVar63 = uVar63 + 0x10;
      } while ((iVar30 + 0xfU & 0xfffffff0) != uVar31);
      iVar28 = iVar28 + 1;
    } while (iVar28 != iVar26);
    pMVar38->tx_size = TVar24;
    iVar30 = (x->e_mbd).tx_type_map_stride;
    (x->e_mbd).tx_type_map[iVar30 * blk_row + blk_col] = uVar2;
    if (((0x41010UL >> (uVar37 & 0x3f) & 1) != 0) || ((0x20810UL >> (uVar37 & 0x3f) & 1) != 0)) {
      local_170 = lVar34 * iVar30 + local_170;
      lVar34 = 0;
      do {
        lVar15 = 0;
        do {
          (x->e_mbd).tx_type_map[lVar15 + local_170] = uVar2;
          lVar15 = lVar15 + 4;
        } while (lVar15 < iVar33);
        lVar34 = lVar34 + 4;
        local_170 = local_170 + (long)iVar30 * 4;
      } while (lVar34 < iVar23);
    }
    iVar33 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar14] * blk_row + blk_col;
    (x->txfm_search_info).blk_skip[iVar33] =
         (x->txfm_search_info).blk_skip[iVar33] & 0xfe | rd_stats->skip_txfm != '\0';
    return;
  }
  rd_stats->rate = (uint)local_1e8;
  rd_stats->zero_rate = (int)(float)local_198;
  rd_stats->dist = (int64_t)local_1b0;
  rd_stats->rdcost = lVar17;
  rd_stats->sse = (int64_t)local_1b8;
  rd_stats->skip_txfm = bVar13;
  *(int *)&rd_stats->field_0x21 = x_sum;
  *(uint *)&rd_stats->field_0x24 = CONCAT31(uStack_188,x_sum._3_1_);
  if (lVar17 != 0x7fffffffffffffff) {
    return;
  }
LAB_0023afeb:
  *is_cost_valid = 0;
  return;
}

Assistant:

static inline void select_tx_block(
    const AV1_COMP *cpi, MACROBLOCK *x, int blk_row, int blk_col, int block,
    TX_SIZE tx_size, int depth, BLOCK_SIZE plane_bsize, ENTROPY_CONTEXT *ta,
    ENTROPY_CONTEXT *tl, TXFM_CONTEXT *tx_above, TXFM_CONTEXT *tx_left,
    RD_STATS *rd_stats, int64_t prev_level_rd, int64_t ref_best_rd,
    int *is_cost_valid, FAST_TX_SEARCH_MODE ftxs_mode) {
  assert(tx_size < TX_SIZES_ALL);
  av1_init_rd_stats(rd_stats);
  if (ref_best_rd < 0) {
    *is_cost_valid = 0;
    return;
  }

  MACROBLOCKD *const xd = &x->e_mbd;
  assert(blk_row < max_block_high(xd, plane_bsize, 0) &&
         blk_col < max_block_wide(xd, plane_bsize, 0));
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int ctx = txfm_partition_context(tx_above + blk_col, tx_left + blk_row,
                                         mbmi->bsize, tx_size);
  struct macroblock_plane *const p = &x->plane[0];

  int try_no_split = (cpi->oxcf.txfm_cfg.enable_tx64 ||
                      txsize_sqr_up_map[tx_size] != TX_64X64) &&
                     (cpi->oxcf.txfm_cfg.enable_rect_tx ||
                      tx_size_wide[tx_size] == tx_size_high[tx_size]);
  int try_split = tx_size > TX_4X4 && depth < MAX_VARTX_DEPTH;
  TxCandidateInfo no_split = { INT64_MAX, 0, TX_TYPES };

  // Prune tx_split and no-split based on sub-block properties.
  if (tx_size != TX_4X4 && try_split == 1 && try_no_split == 1 &&
      cpi->sf.tx_sf.prune_tx_size_level > 0) {
    prune_tx_split_no_split(x, plane_bsize, blk_row, blk_col, tx_size,
                            &try_no_split, &try_split,
                            cpi->sf.tx_sf.prune_tx_size_level);
  }

  if (cpi->sf.rt_sf.skip_tx_no_split_var_based_partition) {
    if (x->try_merge_partition && try_split && p->eobs[block]) try_no_split = 0;
  }

  // Try using current block as a single transform block without split.
  if (try_no_split) {
    try_tx_block_no_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                          plane_bsize, ta, tl, ctx, rd_stats, ref_best_rd,
                          ftxs_mode, &no_split);

    // Speed features for early termination.
    const int search_level = cpi->sf.tx_sf.adaptive_txb_search_level;
    if (search_level) {
      if ((no_split.rd - (no_split.rd >> (1 + search_level))) > ref_best_rd) {
        *is_cost_valid = 0;
        return;
      }
      if (no_split.rd - (no_split.rd >> (2 + search_level)) > prev_level_rd) {
        try_split = 0;
      }
    }
    if (cpi->sf.tx_sf.txb_split_cap) {
      if (p->eobs[block] == 0) try_split = 0;
    }
  }

  // ML based speed feature to skip searching for split transform blocks.
  if (x->e_mbd.bd == 8 && try_split &&
      !(ref_best_rd == INT64_MAX && no_split.rd == INT64_MAX)) {
    const int threshold = cpi->sf.tx_sf.tx_type_search.ml_tx_split_thresh;
    if (threshold >= 0) {
      const int split_score =
          ml_predict_tx_split(x, plane_bsize, blk_row, blk_col, tx_size);
      if (split_score < -threshold) try_split = 0;
    }
  }

  RD_STATS split_rd_stats;
  split_rd_stats.rdcost = INT64_MAX;
  // Try splitting current block into smaller transform blocks.
  if (try_split) {
    try_tx_block_split(cpi, x, blk_row, blk_col, block, tx_size, depth,
                       plane_bsize, ta, tl, tx_above, tx_left, ctx, no_split.rd,
                       AOMMIN(no_split.rd, ref_best_rd), ftxs_mode,
                       &split_rd_stats);
  }

  if (no_split.rd < split_rd_stats.rdcost) {
    ENTROPY_CONTEXT *pta = ta + blk_col;
    ENTROPY_CONTEXT *ptl = tl + blk_row;
    p->txb_entropy_ctx[block] = no_split.txb_entropy_ctx;
    av1_set_txb_context(x, 0, block, tx_size, pta, ptl);
    txfm_partition_update(tx_above + blk_col, tx_left + blk_row, tx_size,
                          tx_size);
    for (int idy = 0; idy < tx_size_high_unit[tx_size]; ++idy) {
      for (int idx = 0; idx < tx_size_wide_unit[tx_size]; ++idx) {
        const int index =
            av1_get_txb_size_index(plane_bsize, blk_row + idy, blk_col + idx);
        mbmi->inter_tx_size[index] = tx_size;
      }
    }
    mbmi->tx_size = tx_size;
    update_txk_array(xd, blk_row, blk_col, tx_size, no_split.tx_type);
    const int bw = mi_size_wide[plane_bsize];
    set_blk_skip(x->txfm_search_info.blk_skip, 0, blk_row * bw + blk_col,
                 rd_stats->skip_txfm);
  } else {
    *rd_stats = split_rd_stats;
    if (split_rd_stats.rdcost == INT64_MAX) *is_cost_valid = 0;
  }
}